

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

JavascriptString * __thiscall
Js::ParseableFunctionInfo::GetCachedSourceString(ParseableFunctionInfo *this)

{
  long *plVar1;
  JavascriptString *pJVar2;
  
  plVar1 = (long *)FunctionProxy::GetAuxPtr(&this->super_FunctionProxy,CachedSourceString);
  if (plVar1 == (long *)0x0) {
    pJVar2 = (JavascriptString *)0x0;
  }
  else {
    pJVar2 = (JavascriptString *)*plVar1;
    if (pJVar2 == (JavascriptString *)0x0) {
      pJVar2 = (JavascriptString *)0x0;
      FunctionProxy::SetAuxPtr(&this->super_FunctionProxy,CachedSourceString,(void *)0x0);
    }
  }
  return pJVar2;
}

Assistant:

JavascriptString * ParseableFunctionInfo::GetCachedSourceString()
    {
        RecyclerWeakReference<JavascriptString> * weakRef = GetCachedSourceStringWeakRef();
        if (weakRef)
        {
            JavascriptString * string = weakRef->Get();
            if (string)
            {
                return string;
            }
            this->SetAuxPtr<AuxPointerType::CachedSourceString>(nullptr);
        }
        return nullptr;
    }